

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::StringTrieBuilder::ListBranchNode::operator==(ListBranchNode *this,Node *other)

{
  UBool UVar1;
  int local_2c;
  int32_t i;
  ListBranchNode *o;
  Node *other_local;
  ListBranchNode *this_local;
  
  if (this == (ListBranchNode *)other) {
    this_local._7_1_ = '\x01';
  }
  else {
    UVar1 = Node::operator==((Node *)this,other);
    if (UVar1 == '\0') {
      this_local._7_1_ = '\0';
    }
    else {
      for (local_2c = 0; local_2c < this->length; local_2c = local_2c + 1) {
        if (((this->units[local_2c] != *(char16_t *)((long)&other[5].hash + (long)local_2c * 2)) ||
            (this->values[local_2c] !=
             *(int *)((long)&other[4].super_UObject._vptr_UObject + (long)local_2c * 4 + 4))) ||
           (this->equal[local_2c] != *(Node **)(&other[1].hash + (long)local_2c * 2))) {
          return '\0';
        }
      }
      this_local._7_1_ = '\x01';
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
StringTrieBuilder::ListBranchNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!Node::operator==(other)) {
        return FALSE;
    }
    const ListBranchNode &o=(const ListBranchNode &)other;
    for(int32_t i=0; i<length; ++i) {
        if(units[i]!=o.units[i] || values[i]!=o.values[i] || equal[i]!=o.equal[i]) {
            return FALSE;
        }
    }
    return TRUE;
}